

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_field_gens.cc
# Opt level: O2

FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *
google::protobuf::compiler::java::MakeImmutableFieldGenerators
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
           *__return_storage_ptr__,Descriptor *descriptor,Context *context)

{
  _Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false> _Var1;
  bool bVar2;
  JavaType JVar3;
  int iVar4;
  int iVar5;
  FieldDescriptor *this;
  Descriptor *pDVar6;
  int iVar7;
  int iVar8;
  int local_78;
  int local_74;
  _Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false> local_70;
  Context *local_68;
  FieldDescriptor *local_60;
  _Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false> local_58;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_50;
  int local_44;
  Descriptor *local_40;
  Context *local_38;
  
  local_50 = __return_storage_ptr__;
  local_38 = context;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (__return_storage_ptr__,descriptor);
  iVar7 = 0;
  iVar8 = 0;
  iVar4 = 0;
  local_40 = descriptor;
  while (iVar4 < local_40->field_count_) {
    this = Descriptor::field(local_40,iVar4);
    local_68 = local_38;
    local_78 = iVar7;
    local_74 = iVar8;
    local_60 = this;
    bVar2 = FieldDescriptor::is_repeated(this);
    local_44 = iVar4;
    if (bVar2) {
      JVar3 = GetJavaType(this);
      if (JVar3 == JAVATYPE_STRING) {
        std::
        make_unique<google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78);
      }
      else if (JVar3 == JAVATYPE_ENUM) {
        std::
        make_unique<google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78);
      }
      else if (JVar3 == JAVATYPE_MESSAGE) {
        pDVar6 = FieldDescriptor::message_type(this);
        if ((pDVar6->options_->field_0)._impl_.map_entry_ == true) {
          std::
          make_unique<google::protobuf::compiler::java::ImmutableMapFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                    ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78)
          ;
        }
        else {
          std::
          make_unique<google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                    ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78)
          ;
        }
      }
      else {
        std::
        make_unique<google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78);
      }
    }
    else {
      bVar2 = IsRealOneof(this);
      JVar3 = GetJavaType(this);
      if (bVar2) {
        if (JVar3 == JAVATYPE_STRING) {
          std::
          make_unique<google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                    ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78)
          ;
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          std::
          make_unique<google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                    ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78)
          ;
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          std::
          make_unique<google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                    ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78)
          ;
        }
        else {
          std::
          make_unique<google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                    ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78)
          ;
        }
      }
      else if (JVar3 == JAVATYPE_STRING) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableStringFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78);
      }
      else if (JVar3 == JAVATYPE_ENUM) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableEnumFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78);
      }
      else if (JVar3 == JAVATYPE_MESSAGE) {
        std::
        make_unique<google::protobuf::compiler::java::ImmutableMessageFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78);
      }
      else {
        std::
        make_unique<google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator,google::protobuf::FieldDescriptor_const*&,int&,int&,google::protobuf::compiler::java::Context*&>
                  ((FieldDescriptor **)&local_70,(int *)&local_60,&local_74,(Context **)&local_78);
      }
    }
    _Var1._M_head_impl = local_70._M_head_impl;
    iVar4 = (*((local_70._M_head_impl)->super_FieldGenerator)._vptr_FieldGenerator[5])
                      (local_70._M_head_impl);
    iVar5 = (*((_Var1._M_head_impl)->super_FieldGenerator)._vptr_FieldGenerator[6])
                      (_Var1._M_head_impl);
    local_58._M_head_impl = _Var1._M_head_impl;
    FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::Add
              (local_50,this,
               (unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                *)&local_58);
    if (local_58._M_head_impl != (ImmutableFieldGenerator *)0x0) {
      (*((local_58._M_head_impl)->super_FieldGenerator)._vptr_FieldGenerator[1])();
    }
    iVar8 = iVar8 + iVar4;
    iVar7 = iVar7 + iVar5;
    local_58._M_head_impl = (ImmutableFieldGenerator *)0x0;
    iVar4 = local_44 + 1;
  }
  return local_50;
}

Assistant:

FieldGeneratorMap<ImmutableFieldGenerator> MakeImmutableFieldGenerators(
    const Descriptor* descriptor, Context* context) {
  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  FieldGeneratorMap<ImmutableFieldGenerator> ret(descriptor);
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    auto generator = MakeImmutableGenerator(field, messageBitIndex,
                                            builderBitIndex, context);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
    ret.Add(field, std::move(generator));
  }
  return ret;
}